

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O3

int __thiscall basisu::histogram::init(histogram *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  uint uVar1;
  void *pvVar2;
  uint32_t new_size;
  uint min_new_capacity;
  
  if ((this->m_hist).m_size != 0) {
    (this->m_hist).m_size = 0;
  }
  min_new_capacity = (uint)ctx;
  if (min_new_capacity != 0) {
    uVar1 = 0;
    if ((this->m_hist).m_capacity < min_new_capacity) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this,min_new_capacity,min_new_capacity == 1,4,(object_mover)0x0
                 ,false);
      uVar1 = (this->m_hist).m_size;
    }
    pvVar2 = memset((this->m_hist).m_p + uVar1,0,(ulong)(min_new_capacity - uVar1) << 2);
    in_EAX = (int)pvVar2;
    (this->m_hist).m_size = min_new_capacity;
  }
  return in_EAX;
}

Assistant:

void init(uint32_t size)
		{
			m_hist.resize(0);
			m_hist.resize(size);
		}